

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall
QTableWidget::setVerticalHeaderItem(QTableWidget *this,int row,QTableWidgetItem *item)

{
  QTableModel *this_00;
  QTableWidgetItem *pQVar1;
  
  if (item != (QTableWidgetItem *)0x0) {
    item->view = this;
    this_00 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
    QTableModel::setVerticalHeaderItem(this_00,row,item);
    return;
  }
  pQVar1 = takeVerticalHeaderItem(this,row);
  if (pQVar1 != (QTableWidgetItem *)0x0) {
    (*pQVar1->_vptr_QTableWidgetItem[1])(pQVar1);
    return;
  }
  return;
}

Assistant:

void QTableWidget::setVerticalHeaderItem(int row, QTableWidgetItem *item)
{
    Q_D(QTableWidget);
    if (item) {
        item->view = this;
        d->tableModel()->setVerticalHeaderItem(row, item);
    } else {
        delete takeVerticalHeaderItem(row);
    }
}